

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test::
TestBody(DescriptorPoolTypeResolverSyntaxTest_SyntaxProto2_Test *this)

{
  TypeResolver *pTVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AlphaNum *in_R8;
  pointer message_00;
  char *in_R9;
  pointer *__ptr;
  string_view file_contents;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Type type;
  internal local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  AlphaNum local_118;
  AlphaNum local_e8;
  StatusRep *local_b8;
  string local_b0;
  Type local_90;
  
  file_contents._M_str =
       "\n    package: \"test\"\n    name: \"foo\"\n    syntax: \"proto2\"\n    message_type { name: \"MyMessage\" }\n  "
  ;
  file_contents._M_len = 99;
  DescriptorPoolTypeResolverSyntaxTest::BuildFile
            (&this->super_DescriptorPoolTypeResolverSyntaxTest,file_contents);
  Type::Type(&local_90,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverSyntaxTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  local_148 = (undefined1  [8])&DAT_00000013;
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1285da0;
  local_118.piece_._M_len = 1;
  local_118.piece_._M_str = "/";
  local_e8.piece_._M_len = 0xe;
  local_e8.piece_._M_str = "test.MyMessage";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b0,(lts_20250127 *)local_148,&local_118,&local_e8,in_R8);
  (*pTVar1->_vptr_TypeResolver[2])(&local_b8,pTVar1,&local_b0,&local_90);
  local_158[0] = (internal)(local_b8 == (StatusRep *)0x1);
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_b8 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_150;
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,local_158,
               (AssertionResult *)
               "resolver_->ResolveMessageType(GetTypeUrl(\"test.MyMessage\"), &type).ok()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x1bd,(char *)local_148);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_148 != (undefined1  [8])local_138) {
      operator_delete((void *)local_148,local_138[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_118.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_118.piece_._M_len + 8))();
    }
    __ptr_00 = local_150;
    if (local_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00bd9ffd;
  }
  else {
    if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_150);
    }
    local_118.piece_._M_len =
         CONCAT44(local_118.piece_._M_len._4_4_,local_90.field_0._impl_.syntax_);
    local_e8.piece_._M_len = local_e8.piece_._M_len & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<google::protobuf::Syntax,google::protobuf::Syntax>
              ((internal *)local_148,"type.syntax()","Syntax::SYNTAX_PROTO2",(Syntax *)&local_118,
               (Syntax *)&local_e8);
    if (local_148[0] == (lts_20250127)0x0) {
      testing::Message::Message((Message *)&local_118);
      if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message_00 = (local_140->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1be,message_00);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((long *)local_118.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_118.piece_._M_len + 8))();
      }
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
    message = anon_var_dwarf_a12c75 + 5;
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
              ((internal *)local_148,"type.edition()","\"\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)local_90.field_0._impl_.edition_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
               (char (*) [1])(anon_var_dwarf_a12c75 + 5));
    if (local_148[0] == (lts_20250127)0x0) {
      testing::Message::Message((Message *)&local_118);
      if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_140->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1bf,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((long *)local_118.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_118.piece_._M_len + 8))();
      }
    }
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00bd9ffd;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_140;
    __ptr_00 = local_140;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00bd9ffd:
  Type::~Type(&local_90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, SyntaxProto2) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "proto2"
    message_type { name: "MyMessage" }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  EXPECT_EQ(type.syntax(), Syntax::SYNTAX_PROTO2);
  EXPECT_EQ(type.edition(), "");
}